

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

TSParser * ts_parser_new(void)

{
  TSParser *pTVar1;
  Stack *pSVar2;
  StackEntry *local_50;
  undefined8 local_48;
  Subtree local_40;
  SubtreePool local_30;
  TSParser *local_10;
  TSParser *self;
  
  local_10 = (TSParser *)ts_calloc(1,0x5c8);
  ts_lexer_init((Lexer *)local_10);
  (local_10->reduce_actions).size = 0;
  (local_10->reduce_actions).capacity = 0;
  (local_10->reduce_actions).contents = (ReduceAction *)0x0;
  array__reserve((VoidArray *)&local_10->reduce_actions,0x10,4);
  pTVar1 = local_10;
  ts_subtree_pool_new(&local_30,0x20);
  (pTVar1->tree_pool).free_trees.contents = local_30.free_trees.contents;
  (pTVar1->tree_pool).free_trees.size = local_30.free_trees.size;
  (pTVar1->tree_pool).free_trees.capacity = local_30.free_trees.capacity;
  (pTVar1->tree_pool).tree_stack.contents = local_30.tree_stack.contents;
  (pTVar1->tree_pool).tree_stack.size = local_30.tree_stack.size;
  (pTVar1->tree_pool).tree_stack.capacity = local_30.tree_stack.capacity;
  pSVar2 = ts_stack_new(&local_10->tree_pool);
  pTVar1 = local_10;
  local_10->stack = pSVar2;
  (local_10->finished_tree).ptr = (SubtreeHeapData *)0x0;
  reusable_node_new();
  (pTVar1->reusable_node).stack.contents = local_50;
  (pTVar1->reusable_node).stack.size = (undefined4)local_48;
  (pTVar1->reusable_node).stack.capacity = local_48._4_4_;
  (pTVar1->reusable_node).last_external_token = local_40;
  local_10->dot_graph_file = (FILE *)0x0;
  local_10->halt_on_error = false;
  local_10->enabled = true;
  local_10->operation_limit = 0xffffffffffffffff;
  (local_10->old_tree).ptr = (SubtreeHeapData *)0x0;
  (local_10->scratch_tree).ptr = &local_10->scratch_tree_data;
  (local_10->included_range_differences).contents = (TSRange *)0x0;
  (local_10->included_range_differences).size = 0;
  (local_10->included_range_differences).capacity = 0;
  local_10->included_range_difference_index = 0;
  ts_parser__set_cached_token(local_10,0,(Subtree)0x0,(Subtree)0x0);
  return local_10;
}

Assistant:

TSParser *ts_parser_new() {
  TSParser *self = ts_calloc(1, sizeof(TSParser));
  ts_lexer_init(&self->lexer);
  array_init(&self->reduce_actions);
  array_reserve(&self->reduce_actions, 4);
  self->tree_pool = ts_subtree_pool_new(32);
  self->stack = ts_stack_new(&self->tree_pool);
  self->finished_tree = NULL_SUBTREE;
  self->reusable_node = reusable_node_new();
  self->dot_graph_file = NULL;
  self->halt_on_error = false;
  self->enabled = true;
  self->operation_limit = SIZE_MAX;
  self->old_tree = NULL_SUBTREE;
  self->scratch_tree.ptr = &self->scratch_tree_data;
  self->included_range_differences = (TSRangeArray) array_new();
  self->included_range_difference_index = 0;
  ts_parser__set_cached_token(self, 0, NULL_SUBTREE, NULL_SUBTREE);
  return self;
}